

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  tbinptr pmVar2;
  tbinptr pmVar3;
  malloc_tree_chunk *pmVar4;
  malloc_tree_chunk *pmVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  tbinptr pmVar9;
  malloc_tree_chunk *pmVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong *puVar14;
  ulong uVar15;
  
  pmVar1 = (tbinptr)((long)&p->prev_foot + psize);
  if ((p->head & 1) == 0) {
    uVar15 = p->prev_foot;
    if ((p->head & 2) == 0) {
      psize = psize + uVar15 + 0x20;
      iVar7 = munmap((void *)((long)p - uVar15),psize);
      if (iVar7 == 0) {
        m->footprint = m->footprint - psize;
      }
LAB_001044c5:
      bVar6 = false;
    }
    else {
      p = (mchunkptr)((long)p - uVar15);
      pmVar2 = (tbinptr)m->least_addr;
      if (p < pmVar2) goto LAB_00104a00;
      psize = psize + uVar15;
      if ((tbinptr)p == (tbinptr)m->dv) {
        uVar15 = pmVar1->head;
        bVar6 = true;
        if ((~(uint)uVar15 & 3) == 0) {
          m->dvsize = psize;
          pmVar1->head = uVar15 & 0xfffffffffffffffe;
          ((tbinptr)p)->head = psize | 1;
          pmVar1->prev_foot = psize;
          goto LAB_001044c5;
        }
      }
      else {
        if (0xff < uVar15) {
          pmVar10 = ((tbinptr)p)->bk;
          pmVar4 = ((tbinptr)p)->child[2];
          if (pmVar10 == (malloc_tree_chunk *)p) {
            pmVar10 = ((tbinptr)p)->child[1];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              pmVar9 = (tbinptr)(((tbinptr)p)->child + 1);
LAB_00104542:
              do {
                if (pmVar10->child[1] == (malloc_tree_chunk *)0x0) {
                  if (pmVar10->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00104556;
                  pmVar9 = (tbinptr)pmVar10->child;
                }
                else {
                  pmVar9 = (tbinptr)(pmVar10->child + 1);
                }
                pmVar10 = (malloc_tree_chunk *)pmVar9->prev_foot;
              } while( true );
            }
            pmVar10 = ((tbinptr)p)->child[0];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              pmVar9 = (tbinptr)((tbinptr)p)->child;
              goto LAB_00104542;
            }
            pmVar10 = (malloc_tree_chunk *)0x0;
          }
          else {
            pmVar9 = ((tbinptr)p)->fd;
            if (((pmVar9 < pmVar2) || (pmVar9->bk != (malloc_tree_chunk *)p)) ||
               (pmVar10->fd != (malloc_tree_chunk *)p)) goto LAB_00104a00;
            pmVar9->bk = pmVar10;
            pmVar10->fd = pmVar9;
          }
          goto LAB_00104566;
        }
        pmVar9 = ((tbinptr)p)->fd;
        pmVar3 = ((tbinptr)p)->bk;
        if ((pmVar9 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
           ((pmVar9 < pmVar2 || (pmVar9->bk != (malloc_tree_chunk *)p)))) goto LAB_00104a00;
        if (pmVar3 == pmVar9) {
          bVar11 = (byte)(uVar15 >> 3) & 0x1f;
          m->smallmap = m->smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        }
        else {
          if ((pmVar3 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
             ((pmVar3 < pmVar2 || (pmVar3->fd != (malloc_tree_chunk *)p)))) goto LAB_00104a00;
          pmVar9->bk = pmVar3;
          pmVar3->fd = pmVar9;
        }
        bVar6 = true;
      }
    }
    goto LAB_001045fe;
  }
  goto LAB_00104607;
code_r0x00104925:
  if (pmVar9 < pmVar2) goto LAB_00104a00;
  pmVar9->prev_foot = 0;
  goto LAB_00104935;
code_r0x00104556:
  if (pmVar9 < pmVar2) goto LAB_00104a00;
  pmVar9->prev_foot = 0;
LAB_00104566:
  bVar6 = true;
  if (pmVar4 == (malloc_tree_chunk *)0x0) goto LAB_001045fe;
  uVar8 = *(uint *)(((tbinptr)p)->child + 3);
  if ((tbinptr)p == m->treebins[uVar8]) {
    m->treebins[uVar8] = pmVar10;
    if (pmVar10 == (malloc_tree_chunk *)0x0) {
      bVar11 = (byte)uVar8 & 0x1f;
      m->treemap = m->treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      goto LAB_001045b3;
    }
  }
  else {
    if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104a00;
    if (pmVar4->child[0] == (malloc_tree_chunk *)p) {
      pmVar4->child[0] = pmVar10;
    }
    else {
      pmVar4->child[1] = pmVar10;
    }
LAB_001045b3:
    if (pmVar10 == (malloc_tree_chunk *)0x0) goto LAB_001045fe;
  }
  pmVar5 = (malloc_tree_chunk *)m->least_addr;
  if (pmVar10 < pmVar5) goto LAB_00104a00;
  pmVar10->child[2] = pmVar4;
  pmVar4 = ((tbinptr)p)->child[0];
  if (pmVar4 != (malloc_tree_chunk *)0x0) {
    if (pmVar4 < pmVar5) goto LAB_00104a00;
    pmVar10->child[0] = pmVar4;
    pmVar4->child[2] = pmVar10;
  }
  pmVar4 = ((tbinptr)p)->child[1];
  if (pmVar4 != (malloc_tree_chunk *)0x0) {
    if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104a00;
    pmVar10->child[1] = pmVar4;
    pmVar4->parent = pmVar10;
  }
LAB_001045fe:
  if (!bVar6) {
    return;
  }
LAB_00104607:
  pmVar2 = (tbinptr)m->least_addr;
  if (pmVar1 < pmVar2) goto LAB_00104a00;
  uVar15 = pmVar1->head;
  if ((uVar15 & 2) == 0) {
    if (pmVar1 == (tbinptr)m->top) {
      uVar15 = psize + m->topsize;
      m->topsize = uVar15;
      m->top = p;
      ((tbinptr)p)->head = uVar15 | 1;
      if ((tbinptr)p != (tbinptr)m->dv) {
        return;
      }
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
      return;
    }
    if (pmVar1 == (tbinptr)m->dv) {
      uVar15 = psize + m->dvsize;
      m->dvsize = uVar15;
      m->dv = p;
      ((tbinptr)p)->head = uVar15 | 1;
      *(ulong *)((long)((tbinptr)p)->child + (uVar15 - 0x20)) = uVar15;
      return;
    }
    if (uVar15 < 0x100) {
      pmVar9 = pmVar1->fd;
      pmVar3 = pmVar1->bk;
      if ((pmVar9 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
         ((pmVar9 < pmVar2 || (pmVar9->bk != pmVar1)))) goto LAB_00104a00;
      if (pmVar3 == pmVar9) {
        bVar11 = (byte)(uVar15 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar3 != (tbinptr)(m->smallbins + (uVar15 >> 3) * 2)) &&
           ((pmVar3 < pmVar2 || (pmVar3->fd != pmVar1)))) goto LAB_00104a00;
        pmVar9->bk = pmVar3;
        pmVar3->fd = pmVar9;
      }
    }
    else {
      pmVar10 = pmVar1->bk;
      pmVar4 = pmVar1->child[2];
      if (pmVar10 == pmVar1) {
        pmVar10 = pmVar1->child[1];
        if (pmVar10 != (malloc_tree_chunk *)0x0) {
          pmVar9 = (tbinptr)(pmVar1->child + 1);
LAB_00104911:
          do {
            if (pmVar10->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar10->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00104925;
              pmVar9 = (tbinptr)pmVar10->child;
            }
            else {
              pmVar9 = (tbinptr)(pmVar10->child + 1);
            }
            pmVar10 = (malloc_tree_chunk *)pmVar9->prev_foot;
          } while( true );
        }
        pmVar10 = pmVar1->child[0];
        if (pmVar10 != (malloc_tree_chunk *)0x0) {
          pmVar9 = (tbinptr)pmVar1->child;
          goto LAB_00104911;
        }
        pmVar10 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar9 = pmVar1->fd;
        if (((pmVar9 < pmVar2) || (pmVar9->bk != pmVar1)) || (pmVar10->fd != pmVar1))
        goto LAB_00104a00;
        pmVar9->bk = pmVar10;
        pmVar10->fd = pmVar9;
      }
LAB_00104935:
      if (pmVar4 != (malloc_tree_chunk *)0x0) {
        uVar8 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar8]) {
          m->treebins[uVar8] = pmVar10;
          if (pmVar10 == (malloc_tree_chunk *)0x0) {
            bVar11 = (byte)uVar8 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
            goto LAB_00104981;
          }
        }
        else {
          if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104a00;
          if (pmVar4->child[0] == pmVar1) {
            pmVar4->child[0] = pmVar10;
          }
          else {
            pmVar4->child[1] = pmVar10;
          }
LAB_00104981:
          if (pmVar10 == (malloc_tree_chunk *)0x0) goto LAB_001049c2;
        }
        pmVar5 = (malloc_tree_chunk *)m->least_addr;
        if (pmVar10 < pmVar5) goto LAB_00104a00;
        pmVar10->child[2] = pmVar4;
        pmVar4 = pmVar1->child[0];
        if (pmVar4 != (malloc_tree_chunk *)0x0) {
          if (pmVar4 < pmVar5) goto LAB_00104a00;
          pmVar10->child[0] = pmVar4;
          pmVar4->child[2] = pmVar10;
        }
        pmVar4 = pmVar1->child[1];
        if (pmVar4 != (malloc_tree_chunk *)0x0) {
          if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00104a00;
          pmVar10->child[1] = pmVar4;
          pmVar4->parent = pmVar10;
        }
      }
    }
LAB_001049c2:
    psize = psize + (uVar15 & 0xfffffffffffffff8);
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
    if ((tbinptr)p == (tbinptr)m->dv) {
      m->dvsize = psize;
      return;
    }
  }
  else {
    pmVar1->head = uVar15 & 0xfffffffffffffffe;
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
  }
  if (psize < 0x100) {
    uVar15 = psize >> 3;
    if ((m->smallmap >> ((uint)uVar15 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << ((byte)uVar15 & 0x1f);
      pmVar10 = (malloc_tree_chunk *)(m->smallbins + uVar15 * 2);
    }
    else {
      pmVar10 = (malloc_tree_chunk *)m->smallbins[uVar15 * 2 + 2];
      if ((malloc_tree_chunk *)m->smallbins[uVar15 * 2 + 2] < (malloc_tree_chunk *)m->least_addr) {
LAB_00104a00:
        abort();
      }
    }
    m->smallbins[uVar15 * 2 + 2] = p;
    pmVar10->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = pmVar10;
    ((tbinptr)p)->bk = (malloc_tree_chunk *)(m->smallbins + uVar15 * 2);
  }
  else {
    uVar8 = (uint)(psize >> 8);
    if (uVar8 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar8 < 0x10000) {
        uVar12 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uint)((psize >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar12 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar10 = (malloc_tree_chunk *)(m->treebins + uVar12);
    *(uint *)(((tbinptr)p)->child + 3) = uVar12;
    ((tbinptr)p)->child[0] = (malloc_tree_chunk *)0x0;
    ((tbinptr)p)->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar12 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar10->prev_foot = (size_t)p;
      ((tbinptr)p)->child[2] = pmVar10;
      ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
      ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
    }
    else {
      pmVar10 = (malloc_tree_chunk *)pmVar10->prev_foot;
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar13 = psize << (bVar11 & 0x3f);
      do {
        if ((pmVar10->head & 0xfffffffffffffff8) == psize) {
          if (((malloc_tree_chunk *)m->least_addr <= pmVar10) &&
             (pmVar4 = pmVar10->fd, (malloc_tree_chunk *)m->least_addr <= pmVar4)) {
            pmVar4->bk = (malloc_tree_chunk *)p;
            pmVar10->fd = (malloc_tree_chunk *)p;
            ((tbinptr)p)->fd = pmVar4;
            ((tbinptr)p)->bk = pmVar10;
            ((tbinptr)p)->child[2] = (malloc_tree_chunk *)0x0;
            return;
          }
          goto LAB_00104a00;
        }
        pmVar4 = *(malloc_tree_chunk **)((long)pmVar10 + (lVar13 >> 0x3f) * -8 + 0x20);
        pmVar5 = pmVar4;
        if (pmVar4 == (malloc_tree_chunk *)0x0) {
          puVar14 = (ulong *)((long)pmVar10 + (lVar13 >> 0x3f) * -8 + 0x20);
          if (puVar14 < m->least_addr) goto LAB_00104a00;
          *puVar14 = (ulong)p;
          ((tbinptr)p)->child[2] = pmVar10;
          ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
          ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
          pmVar5 = pmVar10;
        }
        pmVar10 = pmVar5;
        lVar13 = lVar13 * 2;
      } while (pmVar4 != (malloc_tree_chunk *)0x0);
    }
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}